

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

StructDef * __thiscall flatbuffers::Parser::LookupCreateStruct(Parser *this,string *name)

{
  StructDef *local_20;
  StructDef *struct_def;
  string *name_local;
  Parser *this_local;
  
  local_20 = SymbolTable<flatbuffers::StructDef>::Lookup(&this->structs_,name);
  if (local_20 == (StructDef *)0x0) {
    local_20 = (StructDef *)operator_new(0xf0);
    StructDef::StructDef(local_20);
    SymbolTable<flatbuffers::StructDef>::Add(&this->structs_,name,local_20);
    std::__cxx11::string::operator=((string *)local_20,(string *)name);
    local_20->predecl = true;
  }
  return local_20;
}

Assistant:

StructDef *Parser::LookupCreateStruct(const std::string &name) {
  auto struct_def = structs_.Lookup(name);
  if (!struct_def) {
    // Rather than failing, we create a "pre declared" StructDef, due to
    // circular references, and check for errors at the end of parsing.
    struct_def = new StructDef();
    structs_.Add(name, struct_def);
    struct_def->name = name;
    struct_def->predecl = true;
  }
  return struct_def;
}